

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O1

int __thiscall svm_example::compute_kernels(svm_example *this,svm_params *params)

{
  svm_model *psVar1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  float kv;
  float local_3c;
  ulong local_38;
  
  psVar1 = params->model;
  uVar2 = psVar1->num_support;
  uVar3 = (long)(this->krow)._end - (long)(this->krow)._begin >> 2;
  if (uVar3 < uVar2) {
    num_kernel_evals = num_kernel_evals + uVar3;
    local_38 = uVar3;
    do {
      local_3c = kernel_function(&this->ex,&(psVar1->support_vec)._begin[uVar3]->ex,
                                 params->kernel_params,params->kernel_type);
      v_array<float>::push_back(&this->krow,&local_3c);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
    local_38._0_4_ = (int)uVar2 - (int)local_38;
  }
  else {
    num_cache_evals = num_cache_evals + uVar2;
    local_38._0_4_ = 0;
  }
  return (int)local_38;
}

Assistant:

int svm_example::compute_kernels(svm_params& params)
{
  int alloc = 0;
  svm_model* model = params.model;
  size_t n = model->num_support;

  if (krow.size() < n)
  {
    // computing new kernel values and caching them
    // if(params->curcache + n > params->maxcache)
    // trim_cache(params);
    num_kernel_evals += krow.size();
    // cerr<<"Kernels ";
    for (size_t i = krow.size(); i < n; i++)
    {
      svm_example* sec = model->support_vec[i];
      float kv = kernel_function(&ex, &(sec->ex), params.kernel_params, params.kernel_type);
      krow.push_back(kv);
      alloc += 1;
      // cerr<<kv<<" ";
    }
    // cerr<<endl;
  }
  else
    num_cache_evals += n;
  return alloc;
}